

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int archive_read_format_7zip_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  void *pvVar2;
  uInt len;
  size_t sVar3;
  uLong uVar4;
  
  pvVar2 = a->format->data;
  if (*(int *)((long)pvVar2 + 0x50f8) == -1) {
    *(undefined4 *)((long)pvVar2 + 0x50f8) = 0;
  }
  if (*(long *)((long)pvVar2 + 0x120) != 0) {
    read_consume(a);
  }
  *offset = *(int64_t *)((long)pvVar2 + 0xb8);
  *size = 0;
  *buff = (void *)0x0;
  len = 1;
  if (*(char *)((long)pvVar2 + 0xd0) == '\0') {
    sVar3 = 0x1000000;
    if (*(ulong *)((long)pvVar2 + 0xc0) < 0x1000000) {
      sVar3 = *(ulong *)((long)pvVar2 + 0xc0);
    }
    sVar3 = read_stream(a,buff,sVar3,0);
    len = (uInt)sVar3;
    if (-1 < (long)sVar3) {
      if (sVar3 == 0) {
        archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
        len = 0xffffffe2;
      }
      else {
        plVar1 = (long *)((long)pvVar2 + 0xc0);
        *plVar1 = *plVar1 - sVar3;
        if (*plVar1 == 0) {
          *(undefined1 *)((long)pvVar2 + 0xd0) = 1;
        }
        if ((*(byte *)(*(long *)((long)pvVar2 + 0xa8) + 0x18) & 8) != 0) {
          uVar4 = cm_zlib_z_crc32(*(unsigned_long *)((long)pvVar2 + 200),(uchar *)*buff,len);
          *(uLong *)((long)pvVar2 + 200) = uVar4;
        }
        len = 0;
        if (((*(char *)((long)pvVar2 + 0xd0) != '\0') &&
            ((*(byte *)(*(long *)((long)pvVar2 + 0xa8) + 0x18) & 8) != 0)) &&
           (len = 0, *(ulong *)((long)pvVar2 + 200) !=
                     (ulong)*(uint *)(*(long *)((long)pvVar2 + 0x60) +
                                     (ulong)*(uint *)(*(long *)((long)pvVar2 + 0xa8) + 0x14) * 4)))
        {
          archive_set_error(&a->archive,-1,"7-Zip bad CRC: 0x%lx should be 0x%lx");
          len = 0xffffffec;
        }
        *size = sVar3;
        *offset = *(int64_t *)((long)pvVar2 + 0xb8);
        *(long *)((long)pvVar2 + 0xb8) = *(long *)((long)pvVar2 + 0xb8) + sVar3;
      }
    }
  }
  return len;
}

Assistant:

static int
archive_read_format_7zip_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct _7zip *zip;
	ssize_t bytes;
	int ret = ARCHIVE_OK;

	zip = (struct _7zip *)(a->format->data);

	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	*offset = zip->entry_offset;
	*size = 0;
	*buff = NULL;
	/*
	 * If we hit end-of-entry last time, clean up and return
	 * ARCHIVE_EOF this time.
	 */
	if (zip->end_of_entry)
		return (ARCHIVE_EOF);

	const uint64_t max_read_size = 16 * 1024 * 1024;  // Don't try to read more than 16 MB at a time
	size_t bytes_to_read = max_read_size;
	if ((uint64_t)bytes_to_read > zip->entry_bytes_remaining) {
		bytes_to_read = zip->entry_bytes_remaining;
	}
	bytes = read_stream(a, buff, bytes_to_read, 0);
	if (bytes < 0)
		return ((int)bytes);
	if (bytes == 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated 7-Zip file body");
		return (ARCHIVE_FATAL);
	}
	zip->entry_bytes_remaining -= bytes;
	if (zip->entry_bytes_remaining == 0)
		zip->end_of_entry = 1;

	/* Update checksum */
	if ((zip->entry->flg & CRC32_IS_SET) && bytes)
		zip->entry_crc32 = crc32(zip->entry_crc32, *buff,
		    (unsigned)bytes);

	/* If we hit the end, swallow any end-of-data marker. */
	if (zip->end_of_entry) {
		/* Check computed CRC against file contents. */
		if ((zip->entry->flg & CRC32_IS_SET) &&
			zip->si.ss.digests[zip->entry->ssIndex] !=
		    zip->entry_crc32) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "7-Zip bad CRC: 0x%lx should be 0x%lx",
			    (unsigned long)zip->entry_crc32,
			    (unsigned long)zip->si.ss.digests[
			    		zip->entry->ssIndex]);
			ret = ARCHIVE_WARN;
		}
	}

	*size = bytes;
	*offset = zip->entry_offset;
	zip->entry_offset += bytes;

	return (ret);
}